

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>_>::~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::Array<unsigned_char>_> *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PromiseArenaMember *node;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  puVar1 = (this->attachment).ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->attachment).size_;
    (this->attachment).ptr = (uchar *)0x0;
    (this->attachment).size_ = 0;
    pAVar3 = (this->attachment).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_00644a60;
  node = &((this->super_AttachmentPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }